

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

DynamicType * __thiscall
Js::JavascriptLibrary::GetCachedCustomExternalWrapperType
          (JavascriptLibrary *this,uintptr_t traceCallback,uintptr_t finalizeCallback,
          uintptr_t interceptors,uintptr_t prototype)

{
  bool bVar1;
  WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
  **ppWVar2;
  Recycler *pRVar3;
  WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
  *pWVar4;
  ScriptContext *this_00;
  CustomExternalWrapperCallbacks local_98;
  code *local_78;
  undefined8 local_70;
  TrackAllocData local_68;
  DynamicType *local_40;
  DynamicType *dynamicType;
  RecyclerWeakReference<Js::DynamicType> *dynamicTypeWeakRef;
  uintptr_t prototype_local;
  uintptr_t interceptors_local;
  uintptr_t finalizeCallback_local;
  uintptr_t traceCallback_local;
  JavascriptLibrary *this_local;
  
  dynamicType = (DynamicType *)0x0;
  local_40 = (DynamicType *)0x0;
  dynamicTypeWeakRef = (RecyclerWeakReference<Js::DynamicType> *)prototype;
  prototype_local = interceptors;
  interceptors_local = finalizeCallback;
  finalizeCallback_local = traceCallback;
  traceCallback_local = (uintptr_t)this;
  ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WeakReferenceDictionary__
                      ((WriteBarrierPtr *)&this->customExternalWrapperTypesCache);
  if (*ppWVar2 ==
      (WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
       *)0x0) {
    pRVar3 = this->recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_68,
               (type_info *)
               &JsUtil::
                WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Js::DynamicType,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x132d);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_68);
    local_78 = Memory::Recycler::AllocInlined;
    local_70 = 0;
    pWVar4 = (WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
              *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
    JsUtil::
    WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
    ::WeakReferenceDictionary(pWVar4,this->recycler,3);
    Memory::
    WriteBarrierPtr<JsUtil::WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>_>
    ::operator=(&this->customExternalWrapperTypesCache,pWVar4);
    this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                        (&(this->super_JavascriptLibraryBase).scriptContext);
    ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WeakReferenceDictionary__
                        ((WriteBarrierPtr *)&this->customExternalWrapperTypesCache);
    ScriptContext::RegisterWeakReferenceDictionary
              (this_00,&(*ppWVar2)->super_IWeakReferenceDictionary);
  }
  pWVar4 = Memory::
           WriteBarrierPtr<JsUtil::WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>_>
           ::operator->(&this->customExternalWrapperTypesCache);
  CustomExternalWrapperCallbacks::CustomExternalWrapperCallbacks
            (&local_98,finalizeCallback_local,interceptors_local,prototype_local,
             (uintptr_t)dynamicTypeWeakRef);
  bVar1 = JsUtil::
          BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<Js::JavascriptLibrary::CustomExternalWrapperCallbacks>
                    (&pWVar4->
                      super_BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                     ,&local_98,(RecyclerWeakReference<Js::DynamicType> **)&dynamicType);
  if (bVar1) {
    local_40 = Memory::RecyclerWeakReference<Js::DynamicType>::Get
                         ((RecyclerWeakReference<Js::DynamicType> *)dynamicType);
  }
  return local_40;
}

Assistant:

DynamicType* JavascriptLibrary::GetCachedCustomExternalWrapperType(uintptr_t traceCallback, uintptr_t finalizeCallback, uintptr_t interceptors, uintptr_t prototype)
    {
        RecyclerWeakReference<DynamicType>* dynamicTypeWeakRef = nullptr;
        DynamicType* dynamicType = nullptr;
        if (customExternalWrapperTypesCache == nullptr)
        {
            customExternalWrapperTypesCache = RecyclerNew(recycler, CustomExternalWrapperTypesCache, recycler, 3);
            // Register for periodic cleanup
            scriptContext->RegisterWeakReferenceDictionary(customExternalWrapperTypesCache);
        }
        if (customExternalWrapperTypesCache->TryGetValue(CustomExternalWrapperCallbacks(traceCallback, finalizeCallback, interceptors, prototype), &dynamicTypeWeakRef))
        {
            dynamicType = dynamicTypeWeakRef->Get();
        }
        return dynamicType;
    }